

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_endpoint_refiner.h
# Opt level: O0

void __thiscall crnlib::dxt_endpoint_refiner::params::params(params *this)

{
  params *this_local;
  
  this->m_block_index = 0;
  this->m_pPixels = (color_quad_u8 *)0x0;
  this->m_num_pixels = 0;
  this->m_pSelectors = (uint8 *)0x0;
  this->m_alpha_comp_index = 0;
  this->m_error_to_beat = 0xffffffffffffffff;
  this->m_dxt1_selectors = true;
  this->m_perceptual = true;
  this->m_highest_quality = true;
  return;
}

Assistant:

params() :
                m_block_index(0),
                m_pPixels(nullptr),
                m_num_pixels(0),
                m_pSelectors(nullptr),
                m_alpha_comp_index(0),
                m_error_to_beat(cUINT64_MAX),
                m_dxt1_selectors(true),
                m_perceptual(true),
                m_highest_quality(true)
            {
            }